

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O1

void __thiscall
Diligent::DeviceContextVkImpl::BuildBLAS(DeviceContextVkImpl *this,BuildBLASAttribs *Attribs)

{
  Uint32 *pUVar1;
  atomic<unsigned_int> *paVar2;
  VALUE_TYPE VVar3;
  BottomLevelASVkImpl *pBVar4;
  BufferVkImpl *pBVar5;
  BLASTriangleDesc *pBVar6;
  BLASBuildBoundingBoxData *pBVar7;
  BLASBuildTriangleData *pBVar8;
  DeviceContextVkImpl *this_00;
  pointer pVVar9;
  Uint32 UVar10;
  VkGeometryFlagsKHR VVar11;
  VkFormat VVar12;
  VkIndexType VVar13;
  VkBuildAccelerationStructureFlagsKHR VVar14;
  ulong uVar15;
  VkDeviceAddress VVar16;
  char (*pacVar17) [35];
  ulong uVar18;
  long lVar19;
  ulong uVar20;
  pointer pVVar21;
  string msg;
  VkAccelerationStructureBuildRangeInfoKHR *VkRangePtr;
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  vkGeometries;
  vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  vkRanges;
  VkAccelerationStructureBuildGeometryInfoKHR vkASBuildInfo;
  string local_128;
  VkAccelerationStructureBuildRangeInfoKHR *local_108;
  BufferVkImpl *local_100;
  BuildBLASAttribs *local_f8;
  BLASBuildTriangleData *local_f0;
  DeviceContextVkImpl *local_e8;
  BottomLevelASVkImpl *local_e0;
  vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  local_d8;
  vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  local_b8;
  BufferVkImpl *local_98;
  ulong local_90;
  VkAccelerationStructureBuildGeometryInfoKHR local_88;
  
  DeviceContextBase<Diligent::EngineVkImplTraits>::BuildBLAS
            ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Attribs,0);
  pBVar4 = (BottomLevelASVkImpl *)Attribs->pBLAS;
  if (pBVar4 != (BottomLevelASVkImpl *)0x0) {
    CheckDynamicType<Diligent::BottomLevelASVkImpl,Diligent::IBottomLevelAS>
              ((IBottomLevelAS *)pBVar4);
  }
  pBVar5 = (BufferVkImpl *)Attribs->pScratchBuffer;
  if (pBVar5 != (BufferVkImpl *)0x0) {
    CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar5);
  }
  EnsureVkCmdBuffer(this);
  TransitionOrVerifyBLASState
            (this,pBVar4,Attribs->BLASTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
  local_e8 = this;
  local_98 = pBVar5;
  TransitionOrVerifyBufferState
            (this,pBVar5,Attribs->ScratchBufferTransitionMode,RESOURCE_STATE_BUILD_AS_WRITE,
             VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR,
             "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
  local_88.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
  local_88.scratchData.deviceAddress = 0;
  local_88.geometryCount = 0;
  local_88._52_4_ = 0;
  local_88.pGeometries = (VkAccelerationStructureGeometryKHR *)0x0;
  local_88.srcAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  local_88.dstAccelerationStructure = (VkAccelerationStructureKHR)0x0;
  local_88.type = VK_ACCELERATION_STRUCTURE_TYPE_TOP_LEVEL_KHR;
  local_88.flags = 0;
  local_88.mode = VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
  local_88._28_4_ = 0;
  local_88.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_88._4_4_ = 0;
  local_88.pNext = (void *)0x0;
  local_b8.
  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_b8.
  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8.
  super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_f8 = Attribs;
  local_e0 = pBVar4;
  if (Attribs->pTriangleData == (BLASBuildTriangleData *)0x0) {
    if (Attribs->pBoxData != (BLASBuildBoundingBoxData *)0x0) {
      std::
      vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ::resize(&local_d8,(ulong)Attribs->BoxDataCount);
      pBVar4 = local_e0;
      std::
      vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
      ::resize(&local_b8,(ulong)Attribs->BoxDataCount);
      UVar10 = Attribs->BoxDataCount;
      (pBVar4->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_GeometryCount = UVar10;
      if (UVar10 != 0) {
        lVar19 = 0x20;
        uVar20 = 0;
        do {
          pBVar7 = Attribs->pBoxData;
          local_108 = (VkAccelerationStructureBuildRangeInfoKHR *)
                      CONCAT44(local_108._4_4_,(int)uVar20);
          UVar10 = BottomLevelASBase<Diligent::EngineVkImplTraits>::UpdateGeometryIndex
                             (&local_e0->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
                              *(char **)((long)pBVar7 + lVar19 + -0x20),(Uint32 *)&local_108,
                              Attribs->Update);
          pVVar9 = local_d8.
                   super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if ((int)local_108 == -1 || UVar10 == 0xffffffff) {
            FormatString<char[32]>(&local_128,(char (*) [32])"Failed to find geometry by name");
            DebugAssertionFailed
                      (local_128._M_dataplus._M_p,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xe28);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          else {
            uVar18 = (ulong)local_108 & 0xffffffff;
            pVVar21 = local_b8.
                      super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                      ._M_impl.super__Vector_impl_data._M_start + uVar18;
            local_d8.
            super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar18].sType =
                 VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
            local_d8.
            super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar18].pNext = (void *)0x0;
            VVar11 = GeometryFlagsToVkGeometryFlags
                               (*(RAYTRACING_GEOMETRY_FLAGS *)((long)&pBVar7->GeometryName + lVar19)
                               );
            pVVar9[uVar18].flags = VVar11;
            pVVar9[uVar18].geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;
            pBVar5 = *(BufferVkImpl **)((long)pBVar7 + lVar19 + -0x18);
            if (pBVar5 != (BufferVkImpl *)0x0) {
              CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar5);
            }
            pVVar9[uVar18].geometry.triangles.sType =
                 VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
            pVVar9[uVar18].geometry.triangles.pNext = (void *)0x0;
            *(ulong *)((long)&pVVar9[uVar18].geometry + 0x18) =
                 (ulong)*(uint *)((long)pBVar7 + lVar19 + -8);
            VVar16 = BufferVkImpl::GetVkDeviceAddress(pBVar5);
            uVar15 = VVar16 + *(long *)((long)pBVar7 + lVar19 + -0x10);
            *(ulong *)((long)&pVVar9[uVar18].geometry + 0x10) = uVar15;
            if ((uVar15 & 7) != 0) {
              FormatString<char[43]>
                        (&local_128,(char (*) [43])"AABB start address is not properly aligned");
              DebugAssertionFailed
                        (local_128._M_dataplus._M_p,"BuildBLAS",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0xe3c);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
            TransitionOrVerifyBufferState
                      (local_e8,pBVar5,local_f8->GeometryTransitionMode,RESOURCE_STATE_BUILD_AS_READ
                       ,VK_ACCESS_SHADER_READ_BIT,
                       "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
            pVVar21->transformOffset = 0;
            pVVar21->primitiveOffset = 0;
            pVVar21->firstVertex = 0;
            pVVar21->primitiveCount = *(uint32_t *)((long)pBVar7 + lVar19 + -4);
          }
          uVar20 = uVar20 + 1;
          lVar19 = lVar19 + 0x28;
          Attribs = local_f8;
        } while (uVar20 < local_f8->BoxDataCount);
      }
    }
  }
  else {
    std::
    vector<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
    ::resize(&local_d8,(ulong)Attribs->TriangleDataCount);
    std::
    vector<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
    ::resize(&local_b8,(ulong)Attribs->TriangleDataCount);
    UVar10 = Attribs->TriangleDataCount;
    (pBVar4->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_GeometryCount = UVar10;
    if (UVar10 != 0) {
      lVar19 = 0x50;
      uVar20 = 0;
      do {
        pBVar4 = local_e0;
        local_f0 = Attribs->pTriangleData;
        local_108 = (VkAccelerationStructureBuildRangeInfoKHR *)
                    CONCAT44(local_108._4_4_,(int)uVar20);
        UVar10 = BottomLevelASBase<Diligent::EngineVkImplTraits>::UpdateGeometryIndex
                           (&local_e0->super_BottomLevelASBase<Diligent::EngineVkImplTraits>,
                            *(char **)((long)local_f0 + lVar19 + -0x50),(Uint32 *)&local_108,
                            Attribs->Update);
        pVVar9 = local_d8.
                 super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pBVar8 = local_f0;
        pacVar17 = (char (*) [35])((ulong)local_108 & 0xffffffff);
        if ((int)local_108 == -1 || UVar10 == 0xffffffff) {
          FormatString<char[32]>(&local_128,(char (*) [32])"Failed to find geometry by name");
          DebugAssertionFailed
                    (local_128._M_dataplus._M_p,"BuildBLAS",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                     ,0xdd2);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_128._M_dataplus._M_p != &local_128.field_2) {
            operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          uVar18 = (ulong)local_108 & 0xffffffff;
          pVVar21 = local_b8.
                    super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start + uVar18;
          pBVar6 = (pBVar4->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                   super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                   .m_Desc.pTriangles;
          local_d8.
          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar18].sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
          local_d8.
          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
          ._M_impl.super__Vector_impl_data._M_start[uVar18].pNext = (void *)0x0;
          local_90 = uVar20;
          VVar11 = GeometryFlagsToVkGeometryFlags
                             (*(RAYTRACING_GEOMETRY_FLAGS *)((long)&local_f0->GeometryName + lVar19)
                             );
          pVVar9[uVar18].flags = VVar11;
          pVVar9[uVar18].geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
          pVVar9[uVar18].geometry.triangles.sType =
               VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
          pVVar9[uVar18].geometry.triangles.pNext = (void *)0x0;
          local_100 = *(BufferVkImpl **)((long)pBVar8 + lVar19 + -0x48);
          if (local_100 != (BufferVkImpl *)0x0) {
            CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)local_100);
          }
          VVar12 = TypeToVkFormat(pBVar6[UVar10].VertexValueType,
                                  (uint)pBVar6[UVar10].VertexComponentCount,
                                  pBVar6[UVar10].VertexValueType < VT_FLOAT16);
          pBVar8 = local_f0;
          pVVar9[uVar18].geometry.triangles.vertexFormat = VVar12;
          *(ulong *)((long)&pVVar9[uVar18].geometry + 0x20) =
               (ulong)*(uint *)((long)local_f0 + lVar19 + -0x38);
          if (*(int *)((long)local_f0 + lVar19 + -0x34) == 0) {
            FormatString<char[36]>(&local_128,(char (*) [36])"Vertex count must be greater than 0");
            pacVar17 = (char (*) [35])0xde8;
            DebugAssertionFailed
                      (local_128._M_dataplus._M_p,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xde8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pVVar9[uVar18].geometry.triangles.maxVertex = *(int *)((long)pBVar8 + lVar19 + -0x34) - 1;
          VVar16 = BufferVkImpl::GetVkDeviceAddress(local_100);
          uVar20 = VVar16 + *(long *)((long)local_f0 + lVar19 + -0x40);
          pVVar9[uVar18].geometry.aabbs.stride = uVar20;
          VVar3 = pBVar6[UVar10].VertexValueType;
          if (9 < (ulong)VVar3) {
            FormatString<char[26],char[35]>
                      (&local_128,(Diligent *)"Debug expression failed:\n",
                       (char (*) [26])"Val < _countof(ValueTypeToSizeMap)",pacVar17);
            DebugAssertionFailed
                      (local_128._M_dataplus._M_p,"GetValueSize",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/GraphicsAccessories.hpp"
                       ,0xa6);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          if (uVar20 % (ulong)*(uint *)(ValueTypeToSizeMap + (ulong)VVar3 * 4) != 0) {
            FormatString<char[52]>
                      (&local_128,
                       (char (*) [52])"Vertex buffer start address is not properly aligned");
            DebugAssertionFailed
                      (local_128._M_dataplus._M_p,"BuildBLAS",
                       "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                       ,0xded);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p != &local_128.field_2) {
              operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1
                             );
            }
          }
          pacVar17 = (char (*) [35])0x20000;
          TransitionOrVerifyBufferState
                    (local_e8,local_100,local_f8->GeometryTransitionMode,
                     RESOURCE_STATE_BUILD_AS_READ,VK_ACCESS_SHADER_READ_BIT,
                     "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
          pBVar5 = *(BufferVkImpl **)((long)local_f0 + lVar19 + -0x28);
          if (pBVar5 == (BufferVkImpl *)0x0) {
            pVVar9[uVar18].geometry.triangles.indexType = VK_INDEX_TYPE_NONE_KHR;
            pVVar9[uVar18].geometry.triangles.indexData.deviceAddress = 0;
          }
          else {
            local_100 = pBVar5;
            CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar5);
            VVar13 = TypeToVkIndexType(pBVar6[UVar10].IndexType);
            pVVar9[uVar18].geometry.triangles.indexType = VVar13;
            VVar16 = BufferVkImpl::GetVkDeviceAddress(local_100);
            uVar20 = VVar16 + *(long *)((long)local_f0 + lVar19 + -0x20);
            *(ulong *)((long)&pVVar9[uVar18].geometry + 0x30) = uVar20;
            VVar3 = pBVar6[UVar10].IndexType;
            if (9 < (ulong)VVar3) {
              FormatString<char[26],char[35]>
                        (&local_128,(Diligent *)"Debug expression failed:\n",
                         (char (*) [26])"Val < _countof(ValueTypeToSizeMap)",pacVar17);
              DebugAssertionFailed
                        (local_128._M_dataplus._M_p,"GetValueSize",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/interface/GraphicsAccessories.hpp"
                         ,0xa6);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
            if (uVar20 % (ulong)*(uint *)(ValueTypeToSizeMap + (ulong)VVar3 * 4) != 0) {
              FormatString<char[51]>
                        (&local_128,
                         (char (*) [51])"Index buffer start address is not properly aligned");
              DebugAssertionFailed
                        (local_128._M_dataplus._M_p,"BuildBLAS",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0xdfa);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
            TransitionOrVerifyBufferState
                      (local_e8,local_100,local_f8->GeometryTransitionMode,
                       RESOURCE_STATE_BUILD_AS_READ,VK_ACCESS_SHADER_READ_BIT,
                       "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
          }
          pBVar8 = local_f0;
          pBVar5 = *(BufferVkImpl **)((long)local_f0 + lVar19 + -0x10);
          if (pBVar5 == (BufferVkImpl *)0x0) {
            pVVar9[uVar18].geometry.triangles.transformData.deviceAddress = 0;
          }
          else {
            CheckDynamicType<Diligent::BufferVkImpl,Diligent::IBuffer>((IBuffer *)pBVar5);
            VVar16 = BufferVkImpl::GetVkDeviceAddress(pBVar5);
            pVVar9[uVar18].geometry.triangles.transformData.hostAddress =
                 (void *)(VVar16 + *(long *)((long)pBVar8 + lVar19 + -8));
            if ((*(byte *)((long)&pVVar9[uVar18].geometry + 0x30) & 0xf) != 0) {
              FormatString<char[55]>
                        (&local_128,
                         (char (*) [55])"Transform buffer start address is not properly aligned");
              DebugAssertionFailed
                        (local_128._M_dataplus._M_p,"BuildBLAS",
                         "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                         ,0xe0a);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_128._M_dataplus._M_p != &local_128.field_2) {
                operator_delete(local_128._M_dataplus._M_p,
                                local_128.field_2._M_allocated_capacity + 1);
              }
            }
            TransitionOrVerifyBufferState
                      (local_e8,pBVar5,local_f8->GeometryTransitionMode,RESOURCE_STATE_BUILD_AS_READ
                       ,VK_ACCESS_SHADER_READ_BIT,
                       "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)");
          }
          pVVar21->primitiveCount = *(uint32_t *)((long)pBVar8 + lVar19 + -0x2c);
          pVVar21->primitiveOffset = 0;
          pVVar21->firstVertex = 0;
          pVVar21->transformOffset = 0;
          Attribs = local_f8;
          uVar20 = local_90;
        }
        uVar20 = uVar20 + 1;
        lVar19 = lVar19 + 0x58;
      } while (uVar20 < Attribs->TriangleDataCount);
    }
  }
  pBVar4 = local_e0;
  local_108 = local_b8.
              super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_88.sType = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
  local_88.type = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;
  VVar14 = BuildASFlagsToVkBuildAccelerationStructureFlags
                     ((local_e0->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).
                      super_DeviceObjectBase<Diligent::IBottomLevelASVk,_Diligent::RenderDeviceVkImpl,_Diligent::BottomLevelASDesc>
                      .m_Desc.Flags);
  this_00 = local_e8;
  local_88.flags = VVar14;
  local_88.mode = (uint)Attribs->Update;
  if (Attribs->Update == VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR) {
    local_88.srcAccelerationStructure = (pBVar4->m_VulkanBLAS).m_VkObject;
  }
  else {
    local_88.srcAccelerationStructure = (VkAccelerationStructureKHR_T *)0x0;
  }
  local_88.dstAccelerationStructure = (pBVar4->m_VulkanBLAS).m_VkObject;
  local_88.geometryCount =
       (int)((ulong)((long)local_d8.
                           super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_d8.
                          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 5) * -0x55555555;
  local_88.pGeometries =
       local_d8.
       super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_88.ppGeometries = (VkAccelerationStructureGeometryKHR **)0x0;
  VVar16 = BufferVkImpl::GetVkDeviceAddress(local_98);
  local_88.scratchData.hostAddress = (void *)(VVar16 + Attribs->ScratchBufferOffset);
  if (local_88.scratchData.deviceAddress %
      (ulong)*(uint32_t *)
              ((long)&(((((this_00->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                          super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pDevice.m_pObject)
                        ->m_PhysicalDevice)._M_t.
                        super___uniq_ptr_impl<VulkanUtilities::VulkanPhysicalDevice,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_std::default_delete<VulkanUtilities::VulkanPhysicalDevice>_>
                        .super__Head_base<0UL,_VulkanUtilities::VulkanPhysicalDevice_*,_false>.
                       _M_head_impl)->m_ExtProperties).AccelStruct + 0x38) != 0) {
    FormatString<char[53]>
              (&local_128,(char (*) [53])"Scratch buffer start address is not properly aligned");
    DebugAssertionFailed
              (local_128._M_dataplus._M_p,"BuildBLAS",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
               ,0xe55);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128._M_dataplus._M_p != &local_128.field_2) {
      operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
    }
  }
  EnsureVkCmdBuffer(this_00);
  VulkanUtilities::VulkanCommandBuffer::BuildAccelerationStructure
            (&this_00->m_CommandBuffer,1,&local_88,&local_108);
  pUVar1 = &(this_00->m_State).NumCommands;
  *pUVar1 = *pUVar1 + 1;
  LOCK();
  paVar2 = &(pBVar4->super_BottomLevelASBase<Diligent::EngineVkImplTraits>).m_DvpVersion;
  (paVar2->super___atomic_base<unsigned_int>)._M_i =
       (paVar2->super___atomic_base<unsigned_int>)._M_i + 1;
  UNLOCK();
  if (local_d8.
      super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d8.
                    super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_d8.
                          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d8.
                          super__Vector_base<VkAccelerationStructureGeometryKHR,_std::allocator<VkAccelerationStructureGeometryKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_b8.
      super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_b8.
                    super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_b8.
                          super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.
                          super__Vector_base<VkAccelerationStructureBuildRangeInfoKHR,_std::allocator<VkAccelerationStructureBuildRangeInfoKHR>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::BuildBLAS(const BuildBLASAttribs& Attribs)
{
    TDeviceContextBase::BuildBLAS(Attribs, 0);

    BottomLevelASVkImpl*     pBLASVk    = ClassPtrCast<BottomLevelASVkImpl>(Attribs.pBLAS);
    BufferVkImpl*            pScratchVk = ClassPtrCast<BufferVkImpl>(Attribs.pScratchBuffer);
    const BottomLevelASDesc& BLASDesc   = pBLASVk->GetDesc();

    EnsureVkCmdBuffer();

    const char* OpName = "Build BottomLevelAS (DeviceContextVkImpl::BuildBLAS)";
    TransitionOrVerifyBLASState(*pBLASVk, Attribs.BLASTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, OpName);
    TransitionOrVerifyBufferState(*pScratchVk, Attribs.ScratchBufferTransitionMode, RESOURCE_STATE_BUILD_AS_WRITE, VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR, OpName);

    VkAccelerationStructureBuildGeometryInfoKHR           vkASBuildInfo = {};
    std::vector<VkAccelerationStructureBuildRangeInfoKHR> vkRanges;
    std::vector<VkAccelerationStructureGeometryKHR>       vkGeometries;

    if (Attribs.pTriangleData != nullptr)
    {
        vkGeometries.resize(Attribs.TriangleDataCount);
        vkRanges.resize(Attribs.TriangleDataCount);
        pBLASVk->SetActualGeometryCount(Attribs.TriangleDataCount);

        for (Uint32 i = 0; i < Attribs.TriangleDataCount; ++i)
        {
            const BLASBuildTriangleData& SrcTris = Attribs.pTriangleData[i];

            Uint32 Idx    = i;
            Uint32 GeoIdx = pBLASVk->UpdateGeometryIndex(SrcTris.GeometryName, Idx, Attribs.Update);

            if (GeoIdx == INVALID_INDEX || Idx == INVALID_INDEX)
            {
                UNEXPECTED("Failed to find geometry by name");
                continue;
            }

            VkAccelerationStructureGeometryKHR&              vkGeo   = vkGeometries[Idx];
            VkAccelerationStructureGeometryTrianglesDataKHR& vkTris  = vkGeo.geometry.triangles;
            VkAccelerationStructureBuildRangeInfoKHR&        off     = vkRanges[Idx];
            const BLASTriangleDesc&                          TriDesc = BLASDesc.pTriangles[GeoIdx];

            vkGeo.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
            vkGeo.pNext        = nullptr;
            vkGeo.flags        = GeometryFlagsToVkGeometryFlags(SrcTris.Flags);
            vkGeo.geometryType = VK_GEOMETRY_TYPE_TRIANGLES_KHR;
            vkTris.sType       = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_TRIANGLES_DATA_KHR;
            vkTris.pNext       = nullptr;

            BufferVkImpl* const pVB = ClassPtrCast<BufferVkImpl>(SrcTris.pVertexBuffer);

            // vertex format in SrcTris may be undefined, so use vertex format from description
            vkTris.vertexFormat = TypeToVkFormat(TriDesc.VertexValueType, TriDesc.VertexComponentCount, TriDesc.VertexValueType < VT_FLOAT16);
            vkTris.vertexStride = SrcTris.VertexStride;
            // maxVertex is the number of vertices in vertexData minus one.
            VERIFY(SrcTris.VertexCount > 0, "Vertex count must be greater than 0");
            vkTris.maxVertex                = SrcTris.VertexCount - 1;
            vkTris.vertexData.deviceAddress = pVB->GetVkDeviceAddress() + SrcTris.VertexOffset;

            // geometry.triangles.vertexData.deviceAddress must be aligned to the size in bytes of the smallest component of the format in vertexFormat
            VERIFY(vkTris.vertexData.deviceAddress % GetValueSize(TriDesc.VertexValueType) == 0, "Vertex buffer start address is not properly aligned");

            TransitionOrVerifyBufferState(*pVB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

            if (SrcTris.pIndexBuffer)
            {
                BufferVkImpl* const pIB = ClassPtrCast<BufferVkImpl>(SrcTris.pIndexBuffer);

                // index type in SrcTris may be undefined, so use index type from description
                vkTris.indexType               = TypeToVkIndexType(TriDesc.IndexType);
                vkTris.indexData.deviceAddress = pIB->GetVkDeviceAddress() + SrcTris.IndexOffset;

                // geometry.triangles.indexData.deviceAddress must be aligned to the size in bytes of the type in indexType
                VERIFY(vkTris.indexData.deviceAddress % GetValueSize(TriDesc.IndexType) == 0, "Index buffer start address is not properly aligned");

                TransitionOrVerifyBufferState(*pIB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);
            }
            else
            {
                vkTris.indexType               = VK_INDEX_TYPE_NONE_KHR;
                vkTris.indexData.deviceAddress = 0;
            }

            if (SrcTris.pTransformBuffer)
            {
                BufferVkImpl* const pTB            = ClassPtrCast<BufferVkImpl>(SrcTris.pTransformBuffer);
                vkTris.transformData.deviceAddress = pTB->GetVkDeviceAddress() + SrcTris.TransformBufferOffset;

                // If geometry.triangles.transformData.deviceAddress is not 0, it must be aligned to 16 bytes
                VERIFY(vkTris.indexData.deviceAddress % 16 == 0, "Transform buffer start address is not properly aligned");

                TransitionOrVerifyBufferState(*pTB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);
            }
            else
            {
                vkTris.transformData.deviceAddress = 0;
            }

            off.primitiveCount  = SrcTris.PrimitiveCount;
            off.firstVertex     = 0;
            off.primitiveOffset = 0;
            off.transformOffset = 0;
        }
    }
    else if (Attribs.pBoxData != nullptr)
    {
        vkGeometries.resize(Attribs.BoxDataCount);
        vkRanges.resize(Attribs.BoxDataCount);
        pBLASVk->SetActualGeometryCount(Attribs.BoxDataCount);

        for (Uint32 i = 0; i < Attribs.BoxDataCount; ++i)
        {
            const BLASBuildBoundingBoxData& SrcBoxes = Attribs.pBoxData[i];

            Uint32 Idx    = i;
            Uint32 GeoIdx = pBLASVk->UpdateGeometryIndex(SrcBoxes.GeometryName, Idx, Attribs.Update);

            if (GeoIdx == INVALID_INDEX || Idx == INVALID_INDEX)
            {
                UNEXPECTED("Failed to find geometry by name");
                continue;
            }

            VkAccelerationStructureGeometryKHR&          vkGeo   = vkGeometries[Idx];
            VkAccelerationStructureGeometryAabbsDataKHR& vkAABBs = vkGeo.geometry.aabbs;
            VkAccelerationStructureBuildRangeInfoKHR&    off     = vkRanges[Idx];

            vkGeo.sType        = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_KHR;
            vkGeo.pNext        = nullptr;
            vkGeo.flags        = GeometryFlagsToVkGeometryFlags(SrcBoxes.Flags);
            vkGeo.geometryType = VK_GEOMETRY_TYPE_AABBS_KHR;

            BufferVkImpl* const pBB    = ClassPtrCast<BufferVkImpl>(SrcBoxes.pBoxBuffer);
            vkAABBs.sType              = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_GEOMETRY_AABBS_DATA_KHR;
            vkAABBs.pNext              = nullptr;
            vkAABBs.stride             = SrcBoxes.BoxStride;
            vkAABBs.data.deviceAddress = pBB->GetVkDeviceAddress() + SrcBoxes.BoxOffset;

            // geometry.aabbs.data.deviceAddress must be aligned to 8 bytes
            VERIFY(vkAABBs.data.deviceAddress % 8 == 0, "AABB start address is not properly aligned");

            TransitionOrVerifyBufferState(*pBB, Attribs.GeometryTransitionMode, RESOURCE_STATE_BUILD_AS_READ, VK_ACCESS_SHADER_READ_BIT, OpName);

            off.firstVertex     = 0;
            off.transformOffset = 0;
            off.primitiveOffset = 0;
            off.primitiveCount  = SrcBoxes.BoxCount;
        }
    }

    VkAccelerationStructureBuildRangeInfoKHR const* VkRangePtr = vkRanges.data();

    vkASBuildInfo.sType                     = VK_STRUCTURE_TYPE_ACCELERATION_STRUCTURE_BUILD_GEOMETRY_INFO_KHR;
    vkASBuildInfo.type                      = VK_ACCELERATION_STRUCTURE_TYPE_BOTTOM_LEVEL_KHR;                 // type must be compatible with create info
    vkASBuildInfo.flags                     = BuildASFlagsToVkBuildAccelerationStructureFlags(BLASDesc.Flags); // flags must be compatible with create info
    vkASBuildInfo.mode                      = Attribs.Update ? VK_BUILD_ACCELERATION_STRUCTURE_MODE_UPDATE_KHR : VK_BUILD_ACCELERATION_STRUCTURE_MODE_BUILD_KHR;
    vkASBuildInfo.srcAccelerationStructure  = Attribs.Update ? pBLASVk->GetVkBLAS() : VK_NULL_HANDLE;
    vkASBuildInfo.dstAccelerationStructure  = pBLASVk->GetVkBLAS();
    vkASBuildInfo.geometryCount             = static_cast<uint32_t>(vkGeometries.size());
    vkASBuildInfo.pGeometries               = vkGeometries.data();
    vkASBuildInfo.ppGeometries              = nullptr;
    vkASBuildInfo.scratchData.deviceAddress = pScratchVk->GetVkDeviceAddress() + Attribs.ScratchBufferOffset;

    const VkPhysicalDeviceAccelerationStructurePropertiesKHR& ASLimits = m_pDevice->GetPhysicalDevice().GetExtProperties().AccelStruct;
    VERIFY(vkASBuildInfo.scratchData.deviceAddress % ASLimits.minAccelerationStructureScratchOffsetAlignment == 0, "Scratch buffer start address is not properly aligned");

    EnsureVkCmdBuffer();
    m_CommandBuffer.BuildAccelerationStructure(1, &vkASBuildInfo, &VkRangePtr);
    ++m_State.NumCommands;

#ifdef DILIGENT_DEVELOPMENT
    pBLASVk->DvpUpdateVersion();
#endif
}